

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::lookingAtString(SelectionCompiler *this)

{
  bool bVar1;
  char *pcVar2;
  long in_RDI;
  bool previousCharBackslash;
  char ch;
  int ichT;
  int local_14;
  bool local_1;
  
  if (*(int *)(in_RDI + 0xd8) == *(int *)(in_RDI + 0xd0)) {
    local_1 = false;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
    if (*pcVar2 == '\"') {
      local_14 = *(int *)(in_RDI + 0xd8) + 1;
      bVar1 = false;
      while (local_14 < *(int *)(in_RDI + 0xd0)) {
        local_14 = local_14 + 1;
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
        if ((*pcVar2 == '\"') && (!bVar1)) break;
        if (*pcVar2 == '\\') {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else {
          bVar1 = false;
        }
      }
      *(int *)(in_RDI + 0xdc) = local_14 - *(int *)(in_RDI + 0xd8);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::lookingAtString() {
    if (ichToken == cchScript) return false;
    if (script[ichToken] != '"') return false;
    // remove support for single quote
    // in order to use it in atom expressions
    //    char chFirst = script.charAt(ichToken);
    //    if (chFirst != '"' && chFirst != '\'')
    //      return false;
    int ichT = ichToken + 1;
    //    while (ichT < cchScript && script.charAt(ichT++) != chFirst)
    char ch;
    bool previousCharBackslash = false;
    while (ichT < cchScript) {
      ch = script[ichT++];
      if (ch == '"' && !previousCharBackslash) break;
      previousCharBackslash = ch == '\\' ? !previousCharBackslash : false;
    }
    cchToken = ichT - ichToken;

    return true;
  }